

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_rust.cpp
# Opt level: O3

void __thiscall flatbuffers::rust::RustGenerator::SetNameSpace(RustGenerator *this,Namespace *ns)

{
  CodeWriter *this_00;
  Namespace *pNVar1;
  pointer pbVar2;
  pointer pbVar3;
  size_t __n;
  int iVar4;
  long *plVar5;
  ulong uVar6;
  long *plVar7;
  size_type *psVar8;
  ulong uVar9;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  long lVar14;
  long *local_118;
  long local_110;
  long local_108;
  long lStack_100;
  string local_f8;
  IdlNamer *local_d8;
  long *local_d0 [2];
  long local_c0 [2];
  string local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  string local_50;
  
  pNVar1 = this->cur_name_space_;
  if (pNVar1 != ns) {
    if (pNVar1 == (Namespace *)0x0) {
      uVar6 = 0;
    }
    else {
      uVar6 = (long)(pNVar1->components).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(pNVar1->components).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 5;
    }
    if (ns == (Namespace *)0x0) {
      uVar9 = 0;
    }
    else {
      uVar9 = (long)(ns->components).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(ns->components).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 5;
    }
    uVar13 = uVar9;
    if (uVar6 < uVar9) {
      uVar13 = uVar6;
    }
    if (uVar13 == 0) {
      uVar12 = 0;
    }
    else {
      pbVar2 = (ns->components).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pbVar3 = (pNVar1->components).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar14 = 8;
      uVar11 = 0;
      do {
        __n = *(size_t *)((long)&(pbVar2->_M_dataplus)._M_p + lVar14);
        uVar12 = uVar11;
        if ((__n != *(size_t *)((long)&(pbVar3->_M_dataplus)._M_p + lVar14)) ||
           ((__n != 0 &&
            (iVar4 = bcmp(*(void **)((long)pbVar2 + lVar14 + -8),
                          *(void **)((long)pbVar3 + lVar14 + -8),__n), iVar4 != 0)))) break;
        uVar11 = uVar11 + 1;
        lVar14 = lVar14 + 0x20;
        uVar12 = uVar13;
      } while (uVar13 != uVar11);
    }
    if (uVar12 < uVar6) {
      uVar13 = uVar6;
      lVar14 = uVar6 << 5;
      do {
        std::operator+(&local_90,"}  // pub mod ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&(this->cur_name_space_->components).
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[-1]._M_dataplus._M_p +
                       lVar14));
        CodeWriter::operator+=(&this->code_,&local_90);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90._M_dataplus._M_p != &local_90.field_2) {
          operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
        }
        uVar13 = uVar13 - 1;
        lVar14 = lVar14 + -0x20;
      } while (uVar12 < uVar13);
    }
    if (uVar6 != uVar12) {
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"");
      CodeWriter::operator+=(&this->code_,&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
    }
    lVar14 = uVar9 - uVar12;
    if (lVar14 != 0) {
      this_00 = &this->code_;
      local_d8 = &this->namer_;
      lVar10 = uVar12 << 5;
      do {
        local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_b0,"#[allow(unused_imports, dead_code)]","");
        CodeWriter::operator+=(this_00,&local_b0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
          operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
        }
        (*(this->namer_).super_Namer._vptr_Namer[0x14])
                  (local_d0,local_d8,
                   (long)&(((ns->components).
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar10,
                   (ulong)(this->namer_).super_Namer.config_.namespaces);
        plVar5 = (long *)std::__cxx11::string::replace((ulong)local_d0,0,(char *)0x0,0x372c6b);
        local_118 = &local_108;
        plVar7 = plVar5 + 2;
        if ((long *)*plVar5 == plVar7) {
          local_108 = *plVar7;
          lStack_100 = plVar5[3];
        }
        else {
          local_108 = *plVar7;
          local_118 = (long *)*plVar5;
        }
        local_110 = plVar5[1];
        *plVar5 = (long)plVar7;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        plVar5 = (long *)std::__cxx11::string::append((char *)&local_118);
        psVar8 = (size_type *)(plVar5 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar5 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar8) {
          local_f8.field_2._M_allocated_capacity = *psVar8;
          local_f8.field_2._8_8_ = plVar5[3];
          local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
        }
        else {
          local_f8.field_2._M_allocated_capacity = *psVar8;
          local_f8._M_dataplus._M_p = (pointer)*plVar5;
        }
        local_f8._M_string_length = plVar5[1];
        *plVar5 = (long)psVar8;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        CodeWriter::operator+=(this_00,&local_f8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
          operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
        }
        if (local_118 != &local_108) {
          operator_delete(local_118,local_108 + 1);
        }
        if (local_d0[0] != local_c0) {
          operator_delete(local_d0[0],local_c0[0] + 1);
        }
        GenNamespaceImports(this,2);
        lVar10 = lVar10 + 0x20;
        lVar14 = lVar14 + -1;
      } while (lVar14 != 0);
      if (uVar9 != uVar12) {
        local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"");
        CodeWriter::operator+=(this_00,&local_70);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
        }
      }
    }
    this->cur_name_space_ = ns;
  }
  return;
}

Assistant:

void SetNameSpace(const Namespace *ns) {
    if (cur_name_space_ == ns) { return; }

    // Compute the size of the longest common namespace prefix.
    // If cur_name_space is A::B::C::D and ns is A::B::E::F::G,
    // the common prefix is A::B:: and we have old_size = 4, new_size = 5
    // and common_prefix_size = 2
    size_t old_size = cur_name_space_ ? cur_name_space_->components.size() : 0;
    size_t new_size = ns ? ns->components.size() : 0;

    size_t common_prefix_size = 0;
    while (common_prefix_size < old_size && common_prefix_size < new_size &&
           ns->components[common_prefix_size] ==
               cur_name_space_->components[common_prefix_size]) {
      common_prefix_size++;
    }

    // Close cur_name_space in reverse order to reach the common prefix.
    // In the previous example, D then C are closed.
    for (size_t j = old_size; j > common_prefix_size; --j) {
      code_ += "}  // pub mod " + cur_name_space_->components[j - 1];
    }
    if (old_size != common_prefix_size) { code_ += ""; }

    // open namespace parts to reach the ns namespace
    // in the previous example, E, then F, then G are opened
    for (auto j = common_prefix_size; j != new_size; ++j) {
      code_ += "#[allow(unused_imports, dead_code)]";
      code_ += "pub mod " + namer_.Namespace(ns->components[j]) + " {";
      // Generate local namespace imports.
      GenNamespaceImports(2);
    }
    if (new_size != common_prefix_size) { code_ += ""; }

    cur_name_space_ = ns;
  }